

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

QString * buttonDefaultText(QString *__return_storage_ptr__,int wstyle,int which,
                           QWizardPrivate *wizardPrivate)

{
  char *s;
  
  switch(which) {
  case 0:
    if (wstyle == 2) {
      s = "Go Back";
    }
    else {
      s = "< &Back";
    }
    break;
  case 1:
    if (wstyle == 2) {
      s = "Continue";
    }
    else {
      s = "&Next >";
    }
    break;
  case 2:
    s = "Commit";
    break;
  case 3:
    if (wstyle == 2) {
      s = "Done";
    }
    else {
      s = "&Finish";
    }
    break;
  case 4:
    s = "Cancel";
    break;
  case 5:
    if (wstyle == 2) {
      s = "Help";
    }
    else {
      s = "&Help";
    }
    break;
  default:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
  QWizard::tr(__return_storage_ptr__,s,(char *)0x0,-1);
  return __return_storage_ptr__;
}

Assistant:

static QString buttonDefaultText(int wstyle, int which, const QWizardPrivate *wizardPrivate)
{
#if !QT_CONFIG(style_windowsvista)
    Q_UNUSED(wizardPrivate);
#endif
    const bool macStyle = (wstyle == QWizard::MacStyle);
    switch (which) {
    case QWizard::BackButton:
        return macStyle ? QWizard::tr("Go Back") : QWizard::tr("< &Back");
    case QWizard::NextButton:
        if (macStyle)
            return QWizard::tr("Continue");
        else
            return wizardPrivate->isVistaThemeEnabled()
                ? QWizard::tr("&Next") : QWizard::tr("&Next >");
    case QWizard::CommitButton:
        return QWizard::tr("Commit");
    case QWizard::FinishButton:
        return macStyle ? QWizard::tr("Done") : QWizard::tr("&Finish");
    case QWizard::CancelButton:
        return QWizard::tr("Cancel");
    case QWizard::HelpButton:
        return macStyle ? QWizard::tr("Help") : QWizard::tr("&Help");
    default:
        return QString();
    }
}